

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

void __thiscall
slang::ast::DistVarVisitor::visit<slang::ast::RealLiteral>(DistVarVisitor *this,RealLiteral *expr)

{
  ExpressionKind EVar1;
  RandMode RVar2;
  Symbol *symbol;
  
  EVar1 = (expr->super_Expression).kind;
  if ((EVar1 < Call) && ((0x1c0300U >> (EVar1 & ValueRange) & 1) != 0)) {
    symbol = Expression::getSymbolReference(&expr->super_Expression,true);
    if (symbol != (Symbol *)0x0) {
      RVar2 = ASTContext::getRandMode(this->context,symbol);
      if (RVar2 == RandC) {
        ASTContext::addDiag(this->context,(DiagCode)0x380008,(expr->super_Expression).sourceRange);
        return;
      }
      if (RVar2 == Rand) {
        this->anyRandVars = true;
      }
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                case ExpressionKind::MemberAccess:
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect: {
                    if (auto sym = expr.getSymbolReference()) {
                        RandMode mode = context.getRandMode(*sym);
                        if (mode == RandMode::Rand)
                            anyRandVars = true;
                        else if (mode == RandMode::RandC)
                            context.addDiag(diag::RandCInDist, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, DistVarVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }